

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLcode multi_done(connectdata **connp,CURLcode status,_Bool premature)

{
  connectdata *conn;
  Curl_easy *data;
  Curl_done_func p_Var1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  long lVar5;
  tempbuf *ptVar6;
  CURLcode CVar7;
  ulong uVar8;
  char buffer [256];
  
  conn = *connp;
  data = conn->data;
  CVar7 = CURLE_OK;
  if ((data->state).done == false) {
    Curl_getoff_all_pipelines(data,conn);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    (*Curl_cfree)((data->req).location);
    (data->req).location = (char *)0x0;
    if ((status < CURLE_BAD_FUNCTION_ARGUMENT) &&
       ((0x40004800000U >> ((ulong)status & 0x3f) & 1) != 0)) {
      premature = true;
    }
    p_Var1 = conn->handler->done;
    if (p_Var1 != (Curl_done_func)0x0) {
      status = (*p_Var1)(conn,status,premature);
    }
    if (status == CURLE_ABORTED_BY_CALLBACK) {
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
    }
    else {
      iVar3 = Curl_pgrsDone(conn);
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar3 == 0) {
        CVar7 = status;
      }
      if (status != CURLE_OK) {
        CVar7 = status;
      }
    }
    process_pending_handles(data->multi);
    if (((conn->send_pipe).size == 0) && ((conn->recv_pipe).size == 0)) {
      (data->state).done = true;
      Curl_resolver_cancel(conn);
      if (conn->dns_entry != (Curl_dns_entry *)0x0) {
        Curl_resolv_unlock(data,conn->dns_entry);
        conn->dns_entry = (Curl_dns_entry *)0x0;
      }
      Curl_hostcache_prune(data);
      ptVar6 = (data->state).tempwrite;
      for (uVar8 = 0; uVar8 < (data->state).tempcount; uVar8 = uVar8 + 1) {
        (*Curl_cfree)(ptVar6->buf);
        ptVar6 = ptVar6 + 1;
      }
      (data->state).tempcount = 0;
      if ((((((data->set).reuse_forbid == true) && ((conn->ntlm).state != NTLMSTATE_TYPE2)) &&
           ((conn->proxyntlm).state != NTLMSTATE_TYPE2)) || ((conn->bits).close != false)) ||
         ((premature != false && ((conn->handler->flags & 0x200) == 0)))) {
        CVar4 = Curl_disconnect(conn,premature);
        if (CVar4 == CURLE_OK) {
          CVar4 = CVar7;
        }
        if (CVar7 == CURLE_OK) {
          CVar7 = CVar4;
        }
      }
      else {
        lVar5 = 0x128;
        if ((((conn->bits).socksproxy == false) && (lVar5 = 0x168, (conn->bits).httpproxy == false))
           && (lVar5 = 0xe0, (conn->bits).conn_to_host != false)) {
          lVar5 = 0x108;
        }
        curl_msnprintf(buffer,0x100,"Connection #%ld to host %s left intact",conn->connection_id,
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar5 + -0x20));
        _Var2 = Curl_conncache_return_conn(conn);
        if (_Var2) {
          (data->state).lastconnect = conn;
          Curl_infof(data,"%s\n",buffer);
        }
        else {
          (data->state).lastconnect = (connectdata *)0x0;
        }
      }
      *connp = (connectdata *)0x0;
      Curl_free_request_state(data);
    }
    else {
      data->easy_conn = (connectdata *)0x0;
      CVar7 = CURLE_OK;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode multi_done(struct connectdata **connp,
                          CURLcode status,  /* an error if this is called
                                               after an error was detected */
                          bool premature)
{
  CURLcode result;
  struct connectdata *conn;
  struct Curl_easy *data;
  unsigned int i;

  DEBUGASSERT(*connp);

  conn = *connp;
  data = conn->data;

  DEBUGF(infof(data, "multi_done\n"));

  if(data->state.done)
    /* Stop if multi_done() has already been called */
    return CURLE_OK;

  Curl_getoff_all_pipelines(data, conn);

  /* Cleanup possible redirect junk */
  free(data->req.newurl);
  data->req.newurl = NULL;
  free(data->req.location);
  data->req.location = NULL;

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we're aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we don't. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(conn, status, premature);
  else
    result = status;

  if(CURLE_ABORTED_BY_CALLBACK != result) {
    /* avoid this if we already aborted by callback to avoid this calling
       another callback */
    CURLcode rc = Curl_pgrsDone(conn);
    if(!result && rc)
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  process_pending_handles(data->multi); /* connection / multiplex */

  if(conn->send_pipe.size || conn->recv_pipe.size) {
    /* Stop if pipeline is not empty . */
    data->easy_conn = NULL;
    DEBUGF(infof(data, "Connection still in use, no more multi_done now!\n"));
    return CURLE_OK;
  }

  data->state.done = TRUE; /* called just now! */
  Curl_resolver_cancel(conn);

  if(conn->dns_entry) {
    Curl_resolv_unlock(data, conn->dns_entry); /* done with this */
    conn->dns_entry = NULL;
  }
  Curl_hostcache_prune(data);

  /* if the transfer was completed in a paused state there can be buffered
     data left to free */
  for(i = 0; i < data->state.tempcount; i++) {
    free(data->state.tempwrite[i].buf);
  }
  data->state.tempcount = 0;

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we can't know in what
     state it is for re-using, so we're forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid
#if defined(USE_NTLM)
      && !(conn->ntlm.state == NTLMSTATE_TYPE2 ||
           conn->proxyntlm.state == NTLMSTATE_TYPE2)
#endif
     ) || conn->bits.close
       || (premature && !(conn->handler->flags & PROTOPT_STREAM))) {
    CURLcode res2 = Curl_disconnect(conn, premature); /* close connection */

    /* If we had an error already, make sure we return that one. But
       if we got a new error, return that. */
    if(!result && res2)
      result = res2;
  }
  else {
    char buffer[256];
    /* create string before returning the connection */
    snprintf(buffer, sizeof(buffer),
             "Connection #%ld to host %s left intact",
             conn->connection_id,
             conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
             conn->bits.httpproxy ? conn->http_proxy.host.dispname :
             conn->bits.conn_to_host ? conn->conn_to_host.dispname :
             conn->host.dispname);

    /* the connection is no longer in use */
    if(Curl_conncache_return_conn(conn)) {
      /* remember the most recently used connection */
      data->state.lastconnect = conn;
      infof(data, "%s\n", buffer);
    }
    else
      data->state.lastconnect = NULL;
  }

  *connp = NULL; /* to make the caller of this function better detect that
                    this was either closed or handed over to the connection
                    cache here, and therefore cannot be used from this point on
                 */
  Curl_free_request_state(data);

  return result;
}